

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O1

void __thiscall CreditCard::display(CreditCard *this)

{
  ostream *poVar1;
  
  Transaction::display(&this->super_Transaction);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tPayment Method: Credit Card",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tCard Number: ",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->cardNumber)._M_dataplus._M_p,(this->cardNumber)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tExp. Date: ",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->expirationDate)._M_dataplus._M_p,
                      (this->expirationDate)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tCVV: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->cvv)._M_dataplus._M_p,(this->cvv)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void CreditCard::display() const
{
    Transaction::display();

    cout << "\tPayment Method: Credit Card" << endl << "\tCard Number: " << cardNumber << endl << "\tExp. Date: " << expirationDate << endl
        << "\tCVV: " << cvv << endl;
}